

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O3

bool Grammar::is_keyword_message(string *str)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = is_keyword_message_part(str);
  bVar2 = true;
  if (!bVar1) {
    if (0 < (int)str->_M_string_length) {
      lVar3 = 0;
      do {
        bVar1 = str_utils::is_space((str->_M_dataplus)._M_p[lVar3]);
        if (bVar1) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
          bVar1 = is_keyword_message_part(&local_50);
          if (bVar1) {
            std::__cxx11::string::substr((ulong)&local_90,(ulong)str);
            str_utils::ltrim(&local_70,&local_90);
            bVar1 = is_keyword_message(&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
          }
          else {
            bVar1 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (bVar1 != false) {
            return true;
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < (int)str->_M_string_length);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Grammar::is_keyword_message(const std::string& str) {
    if (is_keyword_message_part(str))
        return true;
    for (int i = 0; i < int(str.size()); i++)
        if (str_utils::is_space(str[i]) && is_keyword_message_part(str.substr(0, i)) &&
            is_keyword_message(str_utils::ltrim(str.substr(i + 1))))
            return true;
    return false;
}